

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O3

void __thiscall
projects::dpg::
DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>::
DiffusionElementMatrixProvider
          (DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
           *this,shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_trial,
          shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test,
          size_type trial_component,size_type test_component,MeshFunctionConstant<double> alpha)

{
  array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL> *__s;
  array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL> *__s_00;
  undefined8 *puVar1;
  RefEl ref_el_type;
  int iVar2;
  int iVar3;
  ScalarReferenceFiniteElement<double> *fe;
  ScalarReferenceFiniteElement<double> *fe_00;
  long lVar4;
  QuadRule qr;
  RefElType local_162 [2];
  DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *local_160;
  size_type local_154;
  array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL> *local_150;
  array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL> *local_148;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *local_140;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *local_138;
  QuadRule local_130;
  QuadRule local_100;
  QuadRule local_d0;
  PrecomputedScalarReferenceFiniteElement<double> local_a0;
  
  (this->super_SubElementMatrixProvider<double>)._vptr_SubElementMatrixProvider =
       (_func_int **)&PTR__DiffusionElementMatrixProvider_003ce8f8;
  (this->alpha_).value_ = alpha.value_;
  __s = &this->fe_precomp_trial_;
  lVar4 = 0;
  local_154 = test_component;
  local_140 = fe_space_test;
  local_138 = fe_space_trial;
  memset(__s,0,0x230);
  do {
    *(undefined ***)
     ((long)&__s->_M_elems[0].super_ScalarReferenceFiniteElement<double>.
             _vptr_ScalarReferenceFiniteElement + lVar4) =
         &PTR__PrecomputedScalarReferenceFiniteElement_003ce5c0;
    *(undefined8 *)((long)&(this->fe_precomp_trial_)._M_elems[0].fe_ + lVar4) = 0;
    lf::quad::QuadRule::QuadRule
              ((QuadRule *)(&(this->fe_precomp_trial_)._M_elems[0].qr_.ref_el_ + lVar4));
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_trial_)._M_elems[0].grad_shape_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_trial_)._M_elems[0].shap_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_trial_)._M_elems[0].shap_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0x230);
  __s_00 = &this->fe_precomp_test_;
  lVar4 = 0;
  local_148 = __s;
  memset(__s_00,0,0x230);
  do {
    *(undefined ***)
     ((long)&__s_00->_M_elems[0].super_ScalarReferenceFiniteElement<double>.
             _vptr_ScalarReferenceFiniteElement + lVar4) =
         &PTR__PrecomputedScalarReferenceFiniteElement_003ce5c0;
    *(undefined8 *)((long)&(this->fe_precomp_test_)._M_elems[0].fe_ + lVar4) = 0;
    lf::quad::QuadRule::QuadRule
              ((QuadRule *)(&(this->fe_precomp_test_)._M_elems[0].qr_.ref_el_ + lVar4));
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_test_)._M_elems[0].grad_shape_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_test_)._M_elems[0].shap_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->fe_precomp_test_)._M_elems[0].shap_fun_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0x230);
  this->trial_component_ = trial_component;
  this->test_component_ = local_154;
  local_162[0] = kTria;
  local_162[1] = kQuad;
  lVar4 = 0;
  local_160 = this;
  local_150 = __s_00;
  do {
    ref_el_type.type_ = local_162[lVar4];
    fe = ProductUniformFESpace<double>::ShapeFunctionLayout
                   ((local_138->
                    super___shared_ptr<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,ref_el_type,this->trial_component_);
    fe_00 = ProductUniformFESpace<double>::ShapeFunctionLayout
                      ((local_140->
                       super___shared_ptr<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,ref_el_type,this->test_component_);
    if (fe_00 != (ScalarReferenceFiniteElement<double> *)0x0 &&
        fe != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar2 = (*fe->_vptr_ScalarReferenceFiniteElement[3])(fe);
      iVar3 = (*fe_00->_vptr_ScalarReferenceFiniteElement[3])(fe_00);
      lf::quad::make_QuadRule(&local_100,ref_el_type,iVar3 + iVar2);
      this = local_160;
      lf::quad::QuadRule::QuadRule(&local_130,&local_100);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement(&local_a0,fe,&local_130);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
                (local_148->_M_elems + ref_el_type.type_,&local_a0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_a0);
      free(local_130.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_130.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      lf::quad::QuadRule::QuadRule(&local_d0,&local_100);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement(&local_a0,fe_00,&local_d0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
                (local_150->_M_elems + ref_el_type.type_,&local_a0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_a0);
      free(local_d0.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_d0.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_100.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_100.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  return;
}

Assistant:

DiffusionElementMatrixProvider<SCALAR, DIFF_COEFF>::
    DiffusionElementMatrixProvider(
        std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_trial,
        std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_test,
        size_type trial_component, size_type test_component, DIFF_COEFF alpha)
    : alpha_(std::move(alpha)),
      trial_component_(trial_component),
      test_component_(test_component),
      fe_precomp_trial_(),
      fe_precomp_test_() {
  for (auto ref_el : {lf::base::RefEl::kTria(), lf::base::RefEl::kQuad()}) {
    // obtain descriptions of local shape functions.
    auto fe_trial =
        fe_space_trial->ShapeFunctionLayout(ref_el, trial_component_);
    auto fe_test = fe_space_test->ShapeFunctionLayout(ref_el, test_component_);

    // check, that  shape functions for both the trial and test space component
    // for that entity are available.
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe_trial != nullptr && fe_test != nullptr) {
      // use a quadrature rule whose degree is the sum of the degrees of the fe
      // spaces.
      size_type degree = fe_trial->Degree() + fe_test->Degree();
      lf::quad::QuadRule qr = lf::quad::make_QuadRule(ref_el, degree);
      // Precompute cell-independent quantities.
      fe_precomp_trial_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(fe_trial, qr);
      fe_precomp_test_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(fe_test, qr);
    }
  }
}